

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int grapg_5_3::m_bfs(m_graph g,int v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  int *piVar9;
  long lVar10;
  
  (&visited)[v] = 1;
  lVar2 = -((ulong)(uint)g.vnum * 4 + 0xf & 0xfffffffffffffff0);
  lVar3 = lVar2 + -0x18;
  lVar5 = 0xffffffff;
  iVar7 = 0;
  iVar8 = 0;
  do {
    if ((&visited)[iVar8] == 0) {
      (&visited)[iVar8] = 1;
      iVar6 = iVar7 + 1;
      *(int *)(&stack0xffffffffffffffe8 + (long)iVar7 * 4 + lVar3 + 0x18) = iVar8;
      bVar1 = (int)lVar5 <= iVar7;
      iVar7 = iVar6;
      if (bVar1) {
        lVar5 = (long)(int)lVar5;
        do {
          iVar8 = *(int *)(&stack0xffffffffffffffec + lVar5 * 4 + lVar2);
          if (0 < g.vnum) {
            piVar9 = &visited;
            uVar4 = 0;
            do {
              if ((g.arc[iVar8][uVar4] == 1) && (*piVar9 == 0)) {
                *piVar9 = 1;
                lVar10 = (long)iVar7;
                iVar7 = iVar7 + 1;
                *(int *)(&stack0xffffffffffffffe8 + lVar10 * 4 + lVar3 + 0x18) = (int)uVar4;
              }
              uVar4 = uVar4 + 1;
              piVar9 = piVar9 + 1;
            } while ((uint)g.vnum != uVar4);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar7);
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int m_bfs(m_graph g, int v) {
        visited[v] = 1;
        //visit;
        int q[g.vnum];
        int f = -1, r = 0;
        for (int i = 0; i < g.vnum; i++) {
            if (visited[i] == 0) {
                visited[i] = 1;
                q[r++] = i;
                while (f < r) {
                    i = q[++f];
                    for (int j = 0; j < g.vnum; j++) {
                        if (g.arc[i][j] == 1 && visited[j] == 0) {
                            visited[j] = 1;
                            //visit
                            q[r++] = j;
                        }
                    }
                }
            }
        }
    }